

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void store_stock_list(store *store,object **list,wchar_t n)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  _Bool _Var4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  object *orig;
  object *new;
  
  uVar2 = store_home_idx;
  if (L'\0' < n) {
    uVar1 = store->sidx;
    uVar5 = 0;
    uVar7 = 0;
    do {
      new = store->stock;
      if (new == (object *)0x0) {
        orig = (object *)0x0;
      }
      else {
        orig = (object *)0x0;
        do {
          if (uVar7 == 0) {
LAB_001d08aa:
            _Var4 = earlier_object(orig,new,uVar1 != uVar2);
            if (_Var4) {
              orig = new;
            }
          }
          else {
            bVar3 = true;
            uVar6 = 0;
            do {
              if (list[uVar6] == new) {
                bVar3 = false;
              }
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
            if (bVar3) goto LAB_001d08aa;
          }
          new = new->next;
        } while (new != (object *)0x0);
      }
      list[uVar5] = orig;
      uVar7 = (uVar7 + 1) - (uint)(orig == (object *)0x0);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)n);
  }
  return;
}

Assistant:

void store_stock_list(struct store *store, struct object **list, int n)
{
	bool not_home = store_is_home(store) ? false : true;
	int list_num;
	int num = 0;

	for (list_num = 0; list_num < n; list_num++) {
		struct object *current, *first = NULL;
		for (current = store->stock; current; current = current->next) {
			int i;
			bool possible = true;

			/* Skip objects already allocated */
			for (i = 0; i < num; i++)
				if (list[i] == current)
					possible = false;

			/* If still possible, choose the first in order */
			if (!possible)
				continue;
			else if (earlier_object(first, current, not_home))
				first = current;
		}

		/* Allocate and count the stock */
		list[list_num] = first;
		if (first)
			num++;
	}
}